

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O2

void __thiscall
ear::PolarExtentCoreSimd<xsimd::sse2>::run
          (PolarExtentCoreSimd<xsimd::sse2> *this,PolarExtentCoreContext *ctx)

{
  float *pfVar1;
  size_t sVar2;
  extent_float_t *peVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 uVar6;
  int iVar7;
  size_t speaker_idx;
  size_t sVar8;
  long lVar9;
  size_t speaker_idx_1;
  ulong uVar10;
  size_t i;
  ulong uVar11;
  float fVar12;
  float fVar13;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  float extraout_XMM0_Dc_02;
  float extraout_XMM0_Dc_03;
  float fVar14;
  float extraout_XMM0_Dc_04;
  float extraout_XMM0_Dc_05;
  float extraout_XMM0_Dc_06;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  float extraout_XMM0_Dd_03;
  float fVar15;
  float extraout_XMM0_Dd_04;
  float extraout_XMM0_Dd_05;
  float extraout_XMM0_Dd_06;
  batch<float,_xsimd::sse2> bVar16;
  batch bVar17;
  batch<float,_xsimd::sse2> bVar18;
  PositionBatch<xsimd::batch<float,_xsimd::sse2>_> pos;
  float local_78;
  float fStack_74;
  PositionBatch<xsimd::batch<float,_xsimd::sse2>_> local_68;
  
  sVar2 = ctx->num_speakers;
  peVar3 = ctx->results;
  for (sVar8 = 0; sVar2 != sVar8; sVar8 = sVar8 + 1) {
    peVar3[sVar8] = 0.0;
  }
  for (uVar11 = 0; uVar11 < ctx->num_points; uVar11 = uVar11 + 4) {
    bVar16 = xsimd::batch<float,_xsimd::sse2>::load_aligned<float>(ctx->xs + uVar11);
    local_68.x.super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc;
    local_68.x.super_simd_register<float,_xsimd::sse2>.data[0] =
         (float)(int)bVar16.super_simd_register<float,_xsimd::sse2>.data._0_8_;
    local_68.x.super_simd_register<float,_xsimd::sse2>.data[1] =
         (float)(int)((ulong)bVar16.super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
    local_68.x.super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd;
    bVar16 = xsimd::batch<float,_xsimd::sse2>::load_aligned<float>(ctx->ys + uVar11);
    local_68.y.super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_00;
    local_68.y.super_simd_register<float,_xsimd::sse2>.data[0] =
         (float)(int)bVar16.super_simd_register<float,_xsimd::sse2>.data._0_8_;
    local_68.y.super_simd_register<float,_xsimd::sse2>.data[1] =
         (float)(int)((ulong)bVar16.super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
    local_68.y.super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_00;
    bVar16 = xsimd::batch<float,_xsimd::sse2>::load_aligned<float>(ctx->zs + uVar11);
    local_68.z.super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_01;
    local_68.z.super_simd_register<float,_xsimd::sse2>.data[0] =
         (float)(int)bVar16.super_simd_register<float,_xsimd::sse2>.data._0_8_;
    local_68.z.super_simd_register<float,_xsimd::sse2>.data[1] =
         (float)(int)((ulong)bVar16.super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
    local_68.z.super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_01;
    if (ctx->is_circular == true) {
      bVar17 = weight_circle(this,ctx,&local_68);
      fVar12 = bVar17.super_simd_register<float,_xsimd::sse2>.data[0];
      fVar13 = bVar17.super_simd_register<float,_xsimd::sse2>.data[1];
      fVar14 = extraout_XMM0_Dc_02;
      fVar15 = extraout_XMM0_Dd_02;
      uVar6 = extraout_EAX;
    }
    else {
      bVar17 = weight_stadium(this,ctx,&local_68);
      fVar12 = bVar17.super_simd_register<float,_xsimd::sse2>.data[0];
      fVar13 = bVar17.super_simd_register<float,_xsimd::sse2>.data[1];
      fVar14 = extraout_XMM0_Dc_03;
      fVar15 = extraout_XMM0_Dd_03;
      uVar6 = extraout_EAX_00;
    }
    auVar5._4_4_ = -(uint)(fVar13 != 1.0);
    auVar5._0_4_ = -(uint)(fVar12 != 1.0);
    auVar5._8_4_ = -(uint)(fVar14 != 1.0);
    auVar5._12_4_ = -(uint)(fVar15 != 1.0);
    iVar7 = movmskps(uVar6,auVar5);
    if (iVar7 == 0) {
      lVar9 = 0;
      for (uVar10 = 0; uVar10 < ctx->num_speakers; uVar10 = uVar10 + 4) {
        bVar16 = xsimd::batch<float,_xsimd::sse2>::load_aligned<float>
                           ((float *)((long)ctx->summed_panning_results +
                                     lVar9 + ctx->num_speakers * uVar11));
        peVar3 = ctx->results;
        bVar18 = xsimd::batch<float,_xsimd::sse2>::load_aligned<float>
                           ((float *)((long)peVar3 + lVar9));
        local_78 = bVar16.super_simd_register<float,_xsimd::sse2>.data[0];
        fStack_74 = bVar16.super_simd_register<float,_xsimd::sse2>.data[1];
        pfVar1 = (float *)((long)peVar3 + lVar9);
        *pfVar1 = bVar18.super_simd_register<float,_xsimd::sse2>.data[0] + local_78;
        pfVar1[1] = bVar18.super_simd_register<float,_xsimd::sse2>.data[1] + fStack_74;
        pfVar1[2] = extraout_XMM0_Dc_06 + extraout_XMM0_Dc_05;
        pfVar1[3] = extraout_XMM0_Dd_06 + extraout_XMM0_Dd_05;
        lVar9 = lVar9 + 0x10;
      }
    }
    else {
      auVar4._4_4_ = -(uint)(fVar13 != 0.0);
      auVar4._0_4_ = -(uint)(fVar12 != 0.0);
      auVar4._8_4_ = -(uint)(fVar14 != 0.0);
      auVar4._12_4_ = -(uint)(fVar15 != 0.0);
      iVar7 = movmskps(iVar7,auVar4);
      if (iVar7 != 0) {
        for (uVar10 = 0; uVar10 < ctx->real_num_speakers; uVar10 = uVar10 + 1) {
          bVar16 = xsimd::batch<float,_xsimd::sse2>::load_aligned<float>
                             (ctx->panning_results + ctx->num_points * uVar10 + uVar11);
          ctx->results[uVar10] =
               extraout_XMM0_Dd_04 * fVar15 +
               bVar16.super_simd_register<float,_xsimd::sse2>.data[1] * fVar13 +
               extraout_XMM0_Dc_04 * fVar14 +
               bVar16.super_simd_register<float,_xsimd::sse2>.data[0] * fVar12 +
               ctx->results[uVar10];
        }
      }
    }
  }
  return;
}

Assistant:

void run(PolarExtentCoreContext &ctx) const override {
      for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
           speaker_idx++)
        ctx.results[speaker_idx] = 0.0;

      for (size_t i = 0; i < ctx.num_points; i += batch::size) {
        PositionBatch<batch> pos;
        pos.x = batch::load_aligned(ctx.xs + i);
        pos.y = batch::load_aligned(ctx.ys + i);
        pos.z = batch::load_aligned(ctx.zs + i);

        batch weight = ctx.is_circular ? weight_circle(ctx, pos)
                                       : weight_stadium(ctx, pos);

        bool all_zeros = xsimd::all(weight == 0.0);
        bool all_ones = xsimd::all(weight == 1.0);
        if (all_ones) {
          // add pre-computed sum for this batch
          size_t batch_i = i / batch::size;
          for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
               speaker_idx += batch::size) {
            batch gain =
                batch::load_aligned(ctx.summed_panning_results +
                                    (batch_i * ctx.num_speakers) + speaker_idx);

            extent_float_t *result_ptr = ctx.results + speaker_idx;
            xsimd::store_aligned(result_ptr,
                                 batch::load_aligned(result_ptr) + gain);
          }
        } else if (!all_zeros) {
          for (size_t speaker_idx = 0; speaker_idx < ctx.real_num_speakers;
               speaker_idx++) {
            batch gain = batch::load_aligned(ctx.panning_results +
                                             speaker_idx * ctx.num_points + i);
            ctx.results[speaker_idx] += xsimd::reduce_add(gain * weight);
          }
        }
      }
    }